

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O3

void pbrt::ComputeBeamDiffusionBSSRDF(Float g,Float eta,BSSRDFTable *t)

{
  uint *puVar1;
  undefined8 *puVar2;
  long end;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined8 uVar51;
  undefined8 uVar52;
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  long in_RDI;
  ushort uVar56;
  ulong uVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  float fVar79;
  undefined1 in_ZMM19 [64];
  undefined1 local_68 [4];
  undefined1 local_64 [4];
  undefined1 local_60 [8];
  long *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  puVar2 = *(undefined8 **)(in_RDI + 0x28);
  *puVar2 = 0x3b23d70a00000000;
  uVar55 = *(ulong *)(in_RDI + 0x38);
  if (2 < uVar55) {
    fVar79 = *(float *)((long)puVar2 + 4);
    uVar54 = 2;
    do {
      fVar79 = fVar79 * 1.2;
      *(float *)((long)puVar2 + uVar54 * 4) = fVar79;
      uVar54 = uVar54 + 1;
    } while (uVar55 != uVar54);
  }
  end = *(long *)(in_RDI + 0x18);
  if (end != 0) {
    auVar58 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar59 = vbroadcastss_avx512f(ZEXT416(0x3da00ac9));
    auVar60 = vbroadcastss_avx512f(ZEXT416(0x3e679a0b));
    auVar61 = vbroadcastss_avx512f(ZEXT416(0x3f321004));
    auVar62 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7fea04));
    auVar64 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar65 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar66 = vpmovsxbd_avx512f(_DAT_0044bc40);
    auVar67 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
    auVar68 = vpbroadcastd_avx512f(ZEXT416(0x3f800000));
    auVar69 = vpbroadcastd_avx512f(ZEXT416(0x807fffff));
    auVar70 = vpbroadcastd_avx512f(ZEXT416(0xffffff82));
    auVar71 = vpbroadcastd_avx512f(ZEXT416(0x7f));
    auVar72 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar73 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar3 = *(long *)(in_RDI + 8);
    auVar50 = vcvtusi2ss_avx512f(in_ZMM19._0_16_,end + -1);
    auVar74 = vpbroadcastq_avx512f();
    uVar55 = 0;
    auVar75 = vbroadcastss_avx512f(auVar50);
    do {
      auVar76 = vpslld_avx512f(auVar66,3);
      uVar51 = vpcmpuq_avx512f(auVar65,auVar74,2);
      uVar52 = vpcmpuq_avx512f(auVar64,auVar74,2);
      bVar53 = (byte)uVar52;
      auVar65 = vpaddq_avx512f(auVar65,auVar72);
      auVar64 = vpaddq_avx512f(auVar64,auVar72);
      auVar66 = vpaddd_avx512f(auVar66,auVar73);
      auVar76 = vpsubd_avx512f(ZEXT1664((undefined1  [16])0x0),auVar76);
      uVar56 = CONCAT11(bVar53,(byte)uVar51);
      auVar76 = vcvtdq2ps_avx512f(auVar76);
      auVar76 = vdivps_avx512f(auVar76,auVar75);
      auVar76 = vmulps_avx512f(auVar76,auVar58);
      auVar77 = vrndscaleps_avx512f(auVar76,9);
      auVar76 = vsubps_avx512f(auVar76,auVar77);
      auVar77 = vcvttps2dq_avx512f(auVar77);
      auVar78 = vfmadd213ps_avx512f(auVar59,auVar76,auVar60);
      auVar78 = vfmadd213ps_avx512f(auVar78,auVar76,auVar61);
      auVar76 = vfmadd213ps_avx512f(auVar78,auVar76,auVar62);
      auVar78 = vpsrld_avx512f(auVar76,0x17);
      auVar77 = vpaddd_avx512f(auVar77,auVar78);
      auVar77 = vpaddd_avx512f(auVar77,auVar67);
      auVar78 = vpslld_avx512f(auVar77,0x17);
      uVar57 = vpcmpd_avx512f(auVar77,auVar70,1);
      uVar57 = uVar56 & uVar57;
      uVar54 = vpcmpgtd_avx512f(auVar77,auVar71);
      uVar54 = uVar56 & uVar54;
      auVar77 = vpaddd_avx512f(auVar78,auVar68);
      auVar76 = vpternlogd_avx512f(auVar77,auVar76,auVar69,0xf8);
      auVar76 = vsubps_avx512f(auVar62,auVar76);
      auVar76 = vdivps_avx512f(auVar76,auVar63);
      auVar77 = vbroadcastss_avx512f(ZEXT416(0x3f800aff));
      bVar4 = (bool)((byte)uVar57 & 1);
      bVar7 = (bool)((byte)(uVar57 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar57 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar57 >> 3) & 1);
      bVar16 = (bool)((byte)(uVar57 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar57 >> 5) & 1);
      bVar22 = (bool)((byte)(uVar57 >> 6) & 1);
      bVar25 = (bool)((byte)(uVar57 >> 7) & 1);
      bVar28 = (bool)((byte)(uVar57 >> 8) & 1);
      bVar30 = (bool)((byte)(uVar57 >> 9) & 1);
      bVar33 = (bool)((byte)(uVar57 >> 10) & 1);
      bVar36 = (bool)((byte)(uVar57 >> 0xb) & 1);
      bVar39 = (bool)((byte)(uVar57 >> 0xc) & 1);
      bVar42 = (bool)((byte)(uVar57 >> 0xd) & 1);
      bVar45 = (bool)((byte)(uVar57 >> 0xe) & 1);
      bVar48 = SUB81(uVar57 >> 0xf,0);
      auVar78 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar5 = (bool)((byte)uVar54 & 1);
      bVar8 = (bool)((byte)(uVar54 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar54 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar54 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar54 >> 4) & 1);
      bVar20 = (bool)((byte)(uVar54 >> 5) & 1);
      bVar23 = (bool)((byte)(uVar54 >> 6) & 1);
      bVar26 = (bool)((byte)(uVar54 >> 7) & 1);
      bVar29 = (bool)((byte)(uVar54 >> 8) & 1);
      bVar31 = (bool)((byte)(uVar54 >> 9) & 1);
      bVar34 = (bool)((byte)(uVar54 >> 10) & 1);
      bVar37 = (bool)((byte)(uVar54 >> 0xb) & 1);
      bVar40 = (bool)((byte)(uVar54 >> 0xc) & 1);
      bVar43 = (bool)((byte)(uVar54 >> 0xd) & 1);
      bVar46 = (bool)((byte)(uVar54 >> 0xe) & 1);
      bVar49 = SUB81(uVar54 >> 0xf,0);
      puVar1 = (uint *)(lVar3 + uVar55 * 4);
      bVar6 = (bool)((byte)uVar51 & 1);
      bVar9 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar56 >> 4) & 1);
      bVar21 = (bool)((byte)(uVar56 >> 5) & 1);
      bVar24 = (bool)((byte)(uVar56 >> 6) & 1);
      bVar27 = (bool)((byte)(uVar56 >> 7) & 1);
      bVar32 = (bool)(bVar53 >> 1 & 1);
      bVar35 = (bool)(bVar53 >> 2 & 1);
      bVar38 = (bool)(bVar53 >> 3 & 1);
      bVar41 = (bool)(bVar53 >> 4 & 1);
      bVar44 = (bool)(bVar53 >> 5 & 1);
      bVar47 = (bool)(bVar53 >> 6 & 1);
      *puVar1 = (uint)bVar6 *
                ((uint)bVar5 * auVar78._0_4_ |
                (uint)!bVar5 * ((uint)bVar4 * auVar77._0_4_ | (uint)!bVar4 * auVar76._0_4_)) |
                (uint)!bVar6 * *puVar1;
      puVar1[1] = (uint)bVar9 *
                  ((uint)bVar8 * auVar78._4_4_ |
                  (uint)!bVar8 * ((uint)bVar7 * auVar77._4_4_ | (uint)!bVar7 * auVar76._4_4_)) |
                  (uint)!bVar9 * puVar1[1];
      puVar1[2] = (uint)bVar12 *
                  ((uint)bVar11 * auVar78._8_4_ |
                  (uint)!bVar11 * ((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar76._8_4_)) |
                  (uint)!bVar12 * puVar1[2];
      puVar1[3] = (uint)bVar15 *
                  ((uint)bVar14 * auVar78._12_4_ |
                  (uint)!bVar14 * ((uint)bVar13 * auVar77._12_4_ | (uint)!bVar13 * auVar76._12_4_))
                  | (uint)!bVar15 * puVar1[3];
      puVar1[4] = (uint)bVar18 *
                  ((uint)bVar17 * auVar78._16_4_ |
                  (uint)!bVar17 * ((uint)bVar16 * auVar77._16_4_ | (uint)!bVar16 * auVar76._16_4_))
                  | (uint)!bVar18 * puVar1[4];
      puVar1[5] = (uint)bVar21 *
                  ((uint)bVar20 * auVar78._20_4_ |
                  (uint)!bVar20 * ((uint)bVar19 * auVar77._20_4_ | (uint)!bVar19 * auVar76._20_4_))
                  | (uint)!bVar21 * puVar1[5];
      puVar1[6] = (uint)bVar24 *
                  ((uint)bVar23 * auVar78._24_4_ |
                  (uint)!bVar23 * ((uint)bVar22 * auVar77._24_4_ | (uint)!bVar22 * auVar76._24_4_))
                  | (uint)!bVar24 * puVar1[6];
      puVar1[7] = (uint)bVar27 *
                  ((uint)bVar26 * auVar78._28_4_ |
                  (uint)!bVar26 * ((uint)bVar25 * auVar77._28_4_ | (uint)!bVar25 * auVar76._28_4_))
                  | (uint)!bVar27 * puVar1[7];
      puVar1[8] = (uint)(bVar53 & 1) *
                  ((uint)bVar29 * auVar78._32_4_ |
                  (uint)!bVar29 * ((uint)bVar28 * auVar77._32_4_ | (uint)!bVar28 * auVar76._32_4_))
                  | (uint)!(bool)(bVar53 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar32 *
                  ((uint)bVar31 * auVar78._36_4_ |
                  (uint)!bVar31 * ((uint)bVar30 * auVar77._36_4_ | (uint)!bVar30 * auVar76._36_4_))
                  | (uint)!bVar32 * puVar1[9];
      puVar1[10] = (uint)bVar35 *
                   ((uint)bVar34 * auVar78._40_4_ |
                   (uint)!bVar34 * ((uint)bVar33 * auVar77._40_4_ | (uint)!bVar33 * auVar76._40_4_))
                   | (uint)!bVar35 * puVar1[10];
      puVar1[0xb] = (uint)bVar38 *
                    ((uint)bVar37 * auVar78._44_4_ |
                    (uint)!bVar37 * ((uint)bVar36 * auVar77._44_4_ | (uint)!bVar36 * auVar76._44_4_)
                    ) | (uint)!bVar38 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar41 *
                    ((uint)bVar40 * auVar78._48_4_ |
                    (uint)!bVar40 * ((uint)bVar39 * auVar77._48_4_ | (uint)!bVar39 * auVar76._48_4_)
                    ) | (uint)!bVar41 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar44 *
                    ((uint)bVar43 * auVar78._52_4_ |
                    (uint)!bVar43 * ((uint)bVar42 * auVar77._52_4_ | (uint)!bVar42 * auVar76._52_4_)
                    ) | (uint)!bVar44 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar47 *
                    ((uint)bVar46 * auVar78._56_4_ |
                    (uint)!bVar46 * ((uint)bVar45 * auVar77._56_4_ | (uint)!bVar45 * auVar76._56_4_)
                    ) | (uint)!bVar47 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar53 >> 7) *
                    ((uint)bVar49 * auVar78._60_4_ |
                    (uint)!bVar49 * ((uint)bVar48 * auVar77._60_4_ | (uint)!bVar48 * auVar76._60_4_)
                    ) | (uint)!(bool)(bVar53 >> 7) * puVar1[0xf];
      uVar55 = uVar55 + 0x10;
    } while ((end + 0xfU & 0xfffffffffffffff0) != uVar55);
  }
  local_50 = 0;
  local_58 = (long *)operator_new(0x18);
  *local_58 = (long)local_60;
  local_58[1] = (long)local_64;
  local_58[2] = (long)local_68;
  local_40 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
             ::_M_manager;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  local_38._M_unused._M_object = &local_58;
  ParallelFor(0,end,(function<void_(long,_long)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] =
            (1 - FastExp(-8 * i / (Float)(t->rhoSamples.size() - 1))) / (1 - FastExp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] = IntegrateCatmullRom(
            t->radiusSamples,
            pstd::span<const Float>(&t->profile[i * nSamples], nSamples),
            pstd::span<Float>(&t->profileCDF[i * nSamples], nSamples));
    });
}